

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O3

uint XXH32(void *input,int len,U32 seed)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  pbVar1 = (byte *)((long)input + (long)len);
  if (len < 0x10) {
    iVar3 = seed + 0x165667b1;
  }
  else {
    uVar7 = seed + 0x24234428;
    uVar6 = seed + 0x85ebca77;
    uVar2 = seed + 0x61c8864f;
    do {
      uVar7 = *input * -0x7a143589 + uVar7;
      uVar8 = uVar7 * 0x2000 | uVar7 >> 0x13;
      uVar6 = *(int *)((long)input + 4) * -0x7a143589 + uVar6;
      uVar4 = uVar6 * 0x2000 | uVar6 >> 0x13;
      uVar7 = uVar8 * -0x61c8864f;
      uVar6 = *(int *)((long)input + 8) * -0x7a143589 + seed;
      uVar5 = uVar6 * 0x2000 | uVar6 >> 0x13;
      uVar6 = uVar4 * -0x61c8864f;
      uVar2 = *(int *)((long)input + 0xc) * -0x7a143589 + uVar2;
      uVar9 = uVar2 * 0x2000 | uVar2 >> 0x13;
      seed = uVar5 * -0x61c8864f;
      uVar2 = uVar9 * -0x61c8864f;
      input = (void *)((long)input + 0x10);
    } while (input <= pbVar1 + -0x10);
    iVar3 = (uVar2 >> 0xe) +
            uVar9 * -0x193c0000 + (seed >> 0x14) + uVar5 * 0x779b1000 +
            (uVar6 >> 0x19) + uVar4 * 0x1bbcd880 + (uVar7 >> 0x1f | uVar8 * 0x3c6ef362);
  }
  uVar2 = iVar3 + len;
  for (; input <= pbVar1 + -4; input = (void *)((long)input + 4)) {
    uVar2 = *input * -0x3d4d51c3 + uVar2;
    uVar2 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  }
  for (; input < pbVar1; input = (void *)((long)input + 1)) {
    uVar2 = (uint)*input * 0x165667b1 + uVar2;
    uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
  }
  uVar2 = (uVar2 >> 0xf ^ uVar2) * -0x7a143589;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51c3;
  return uVar2 >> 0x10 ^ uVar2;
}

Assistant:

U32 XXH32(const void* input, int len, U32 seed)
{
#if 0
    // Simple version, good for code maintenance, but unfortunately slow for small inputs
    void* state = XXH32_init(seed);
    XXH32_update(state, input, len);
    return XXH32_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

#  if !defined(XXH_USE_UNALIGNED_ACCESS)
    if ((((size_t)input) & 3))   // Input is aligned, let's leverage the speed advantage
    {
        if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
            return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
        else
            return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }
#  endif

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}